

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O2

SQInteger array_resize(HSQUIRRELVM v)

{
  SQObjectPtr *pSVar1;
  SQObjectPtr *pSVar2;
  SQRESULT SVar3;
  SQInteger SVar4;
  SQObjectPtr *obj;
  SQObjectPtr fill;
  
  pSVar1 = stack_get(v,1);
  pSVar2 = stack_get(v,2);
  fill.super_SQObject._type = OT_NULL;
  fill.super_SQObject._unVal.pTable = (SQTable *)0x0;
  if (((pSVar2->super_SQObject)._type & 0x4000000) == 0) {
    SVar3 = sq_throwerror(v,"size must be a number");
  }
  else {
    SVar4 = sq_gettop(v);
    if (2 < SVar4) {
      obj = stack_get(v,3);
      SQObjectPtr::operator=(&fill,obj);
    }
    if ((pSVar2->super_SQObject)._type == OT_FLOAT) {
      SVar4 = (SQInteger)(pSVar2->super_SQObject)._unVal.fFloat;
    }
    else {
      SVar4 = (pSVar2->super_SQObject)._unVal.nInteger;
    }
    SQArray::Resize((pSVar1->super_SQObject)._unVal.pArray,SVar4,&fill);
    SVar3 = 0;
  }
  SQObjectPtr::~SQObjectPtr(&fill);
  return SVar3;
}

Assistant:

static SQInteger array_resize(HSQUIRRELVM v)
{
    SQObject &o = stack_get(v, 1);
    SQObject &nsize = stack_get(v, 2);
    SQObjectPtr fill;
    if(sq_isnumeric(nsize)) {
        if(sq_gettop(v) > 2)
            fill = stack_get(v, 3);
        _array(o)->Resize(tointeger(nsize),fill);
        return 0;
    }
    return sq_throwerror(v, _SC("size must be a number"));
}